

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.h
# Opt level: O2

void __thiscall Thread::~Thread(Thread *this)

{
  std::__cxx11::string::~string((string *)&this->link);
  std::__cxx11::string::~string((string *)&this->title);
  std::__cxx11::string::~string((string *)&this->selftext);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Thread(const Json& json) {
			id = json["id"].get<std::string>();

			selftext = replaceHtmlSymbols(json["selftext"].get<std::string>());
			str::replace_all(selftext, "\\_", "_");

			title = replaceHtmlSymbols(json["title"].get<std::string>());
			str::replace_all(title, "\\_", "_");

			link = "https://www.reddit.com" + json["permalink"].get<std::string>();
		}